

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O3

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindResult *__return_storage_ptr__,
      BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
      *this,BoyerMooreTextState *state,void *p0,size_t size,utf32_t replacementChar)

{
  uint_t uVar1;
  uint_t uVar2;
  BoyerMooreTextFindResult *pBVar3;
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *pBVar4;
  size_t i;
  size_t binOffset;
  C *p0_00;
  ulong length;
  size_t binSize;
  uint decoderState;
  size_t textLength;
  Dfa local_47c;
  BoyerMooreTextFindResult *local_470;
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *local_468;
  C *local_460;
  BoyerMooreTextAccessor accessor;
  utf32_t buffer [256];
  
  local_470 = __return_storage_ptr__;
  if (0 < (long)size) {
    p0_00 = (C *)((long)p0 + (size - 1));
    decoderState = state->m_decoderState;
    local_468 = &this->
                 super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
    ;
    do {
      accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
      .m_p = (wchar_t *)
             CONCAT44(accessor.
                      super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
                      .m_p._4_4_,replacementChar);
      local_47c.super_UtfDfa<axl::enc::Utf8ReverseDfa,_axl::enc::Utf8CcMap>.m_cp = 0;
      local_47c.super_UtfDfa<axl::enc::Utf8ReverseDfa,_axl::enc::Utf8CcMap>.m_state =
           *(uint_t *)(enc::Utf8ReverseDfa::m_stateDb + (decoderState >> 0x19 & 0x3c));
      local_47c.m_acc = decoderState & 0xffffff;
      local_460 = p0_00;
      accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
      .m_state = (BoyerMooreTextState *)buffer;
      p0_00 = enc::Utf8ReverseDecoder::
              decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::enc::ToCaseFolded,axl::enc::Utf8ReverseDecoder>::EncodingEmitter_s>
                        (&local_47c,(EncodingEmitter_s *)&accessor,p0_00,(C *)((long)p0 + -1));
      pBVar4 = local_468;
      uVar2 = local_47c.m_acc;
      uVar1 = local_47c.super_UtfDfa<axl::enc::Utf8ReverseDfa,_axl::enc::Utf8CcMap>.m_state;
      textLength = (long)accessor.
                         super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
                         .m_state - (long)buffer >> 2;
      length = (state->super_BoyerMooreStateBase<wchar_t>).m_tail.m_length + textLength;
      accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
      .m_state = state;
      accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
      .m_p = (wchar_t *)buffer;
      i = BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
          ::findImpl<axl::sl::BoyerMooreTextAccessor>(local_468,&accessor,0,length);
      pBVar3 = local_470;
      if (i + (pBVar4->m_pattern).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count
          <= length) {
        createFindResult(local_470,
                         (BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                          *)local_468,state,i,local_460,p0_00);
        return pBVar3;
      }
      binSize = (long)local_460 - (long)p0_00;
      decoderState = uVar1 << 0x18 | uVar2;
      binOffset = locateBinOffset(state,i,local_460,p0_00);
      BoyerMooreTextState::advance<true>
                (state,i,buffer,textLength,binOffset,p0_00 + 1,binSize,decoderState);
    } while ((C *)((long)p0 + -1) < p0_00);
  }
  *(undefined4 *)&local_470->m_charOffset = 0xffffffff;
  *(undefined4 *)((long)&local_470->m_charOffset + 4) = 0xffffffff;
  *(undefined4 *)&local_470->m_binOffset = 0xffffffff;
  *(undefined4 *)((long)&local_470->m_binOffset + 4) = 0xffffffff;
  local_470->m_binEndOffset = 0xffffffffffffffff;
  return local_470;
}

Assistant:

BoyerMooreTextFindResult
	find(
		BoyerMooreTextState* state,
		const void* p0,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		ASSERT(state->getPatternLength() == this->m_pattern.getCount());

		sl::PtrIterator<const char, IsReverse> p(IsReverse ? (char*)p0 + size - 1 : (char*)p0);
		const char* end = p + size;

		enc::DecoderState decoderState = state->getDecoderState();

		while (p < end) {
			utf32_t buffer[Details::DecoderBufferLength];

			typename Convert::Result convertResult = Convert::convert(
				&decoderState,
				buffer,
				buffer + countof(buffer),
				p,
				end,
				replacementChar
			);

			const char* p2 = convertResult.m_src; // just a short alias
			size_t srcLength = -(p - p2); // respect IsReverse
			size_t dstLength = convertResult.m_dst - buffer;
			size_t fullLength = state->getTailLength() + dstLength;
			size_t i;

			BoyerMooreTextAccessor accessor(state, buffer);

			if (IsWholeWord) {
				i = findWholeWordImpl(state, accessor, fullLength);
				if (i + this->m_pattern.getCount() < fullLength) // account for suffix
					return createFindResult(state, i, p, p2);

			} else {
				i = this->findImpl(accessor, 0, fullLength);
				if (i + this->m_pattern.getCount() <= fullLength)
					return createFindResult(state, i, p, p2);
			}

			// locate bin-offset of the prospective start of match
			size_t binOffset = locateBinOffset(state, i, p, p2);

			state->advance<IsReverse>(
				i,
				buffer,
				dstLength,
				binOffset,
				IsReverse ? p2 + 1 : (const char*)p,
				srcLength,
				decoderState
			);

 			ASSERT(state->getBinTailSize() >= state->getTailLength());
			p = p2;
		}

		return BoyerMooreTextFindResult();
	}